

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  cmValue cVar5;
  cmState *pcVar6;
  pointer suffix;
  string library;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,0,
             (char *)(this->super_cmFindBase).super_cmFindCommon.CMakePathName._M_string_length,
             0x6b81e6);
  iVar4 = (*(this->super_cmFindBase)._vptr_cmFindBase[2])(this,argsIn);
  bVar2 = SUB41(iVar4,0);
  if (bVar2 == false) {
    return false;
  }
  bVar3 = cmFindCommon::ComputeIfDebugModeWanted
                    (&(this->super_cmFindBase).super_cmFindCommon,
                     &(this->super_cmFindBase).VariableName);
  (this->super_cmFindBase).super_cmFindCommon.DebugMode = bVar3;
  if ((this->super_cmFindBase).AlreadyDefined == true) {
    cmFindBase::NormalizeFindResult(&this->super_cmFindBase);
    return bVar2;
  }
  this_00 = (this->super_cmFindBase).super_cmFindCommon.Makefile;
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX","");
  cVar5 = cmMakefile::GetDefinition(this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (cVar5.Value == (string *)0x0) {
    bVar3 = cmMakefile::PlatformIs32Bit((this->super_cmFindBase).super_cmFindCommon.Makefile);
    if (bVar3) {
      pcVar6 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"FIND_LIBRARY_USE_LIB32_PATHS","");
      bVar3 = cmState::GetGlobalPropertyAsBool(pcVar6,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3 == false) {
      bVar3 = cmMakefile::PlatformIs64Bit((this->super_cmFindBase).super_cmFindCommon.Makefile);
      if (bVar3) {
        pcVar6 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"FIND_LIBRARY_USE_LIB64_PATHS","");
        bVar3 = cmState::GetGlobalPropertyAsBool(pcVar6,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar3 = false;
      }
      if (bVar3 == false) {
        bVar3 = cmMakefile::PlatformIsx32((this->super_cmFindBase).super_cmFindCommon.Makefile);
        if (bVar3) {
          pcVar6 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"FIND_LIBRARY_USE_LIBX32_PATHS","");
          bVar3 = cmState::GetGlobalPropertyAsBool(pcVar6,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar3 = false;
        }
        if (bVar3 == false) goto LAB_001e0b46;
        suffix = "x32";
      }
      else {
        suffix = "64";
      }
    }
    else {
      suffix = "32";
    }
  }
  else {
    suffix = ((cVar5.Value)->_M_dataplus)._M_p;
  }
  AddArchitecturePaths(this,suffix);
LAB_001e0b46:
  FindLibrary_abi_cxx11_(&local_48,this);
  cmFindBase::StoreFindResult(&this->super_cmFindBase,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmFindLibraryCommand::InitialPass(std::vector<std::string> const& argsIn)
{
  this->CMakePathName = "LIBRARY";

  if (!this->ParseArguments(argsIn)) {
    return false;
  }

  this->DebugMode = this->ComputeIfDebugModeWanted(this->VariableName);

  if (this->AlreadyDefined) {
    this->NormalizeFindResult();
    return true;
  }

  // add custom lib<qual> paths instead of using fixed lib32, lib64 or
  // libx32
  if (cmValue customLib = this->Makefile->GetDefinition(
        "CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX")) {
    this->AddArchitecturePaths(customLib->c_str());
  }
  // add special 32 bit paths if this is a 32 bit compile.
  else if (this->Makefile->PlatformIs32Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB32_PATHS")) {
    this->AddArchitecturePaths("32");
  }
  // add special 64 bit paths if this is a 64 bit compile.
  else if (this->Makefile->PlatformIs64Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB64_PATHS")) {
    this->AddArchitecturePaths("64");
  }
  // add special 32 bit paths if this is an x32 compile.
  else if (this->Makefile->PlatformIsx32() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIBX32_PATHS")) {
    this->AddArchitecturePaths("x32");
  }

  std::string const library = this->FindLibrary();
  this->StoreFindResult(library);
  return true;
}